

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numberobserver.cpp
# Opt level: O3

void __thiscall NumberObserver::onNotified(NumberObserver *this)

{
  ulong in_RAX;
  uint index;
  DataTable *this_00;
  int data;
  undefined8 uStack_28;
  
  this_00 = (this->super_DataTableObserver)._table;
  if (0 < (int)((ulong)((long)(this_00->_table).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this_00->_table).super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2)) {
    index = 0;
    uStack_28 = in_RAX;
    do {
      DataTable::get(this_00,index,(int *)((long)&uStack_28 + 4));
      printf("%d: %d\n",(ulong)index,uStack_28 >> 0x20);
      index = index + 1;
      this_00 = (this->super_DataTableObserver)._table;
    } while ((int)index <
             (int)((ulong)((long)(this_00->_table).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this_00->_table).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  return;
}

Assistant:

void NumberObserver::onNotified()
{
	for (int i = 0; i < _table->count(); ++i) {
		int data;
		_table->get(i, &data);
		printData(data, i);
	}
}